

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O1

string * __thiscall
soul::ASTUtilities::getTypeArraySignature_abi_cxx11_
          (string *__return_storage_ptr__,ASTUtilities *this,TypeArray *types)

{
  ulong __val;
  Structure *pSVar1;
  bool bVar2;
  char cVar3;
  long *plVar4;
  ulong uVar5;
  long *plVar6;
  string *__str;
  char cVar7;
  long lVar8;
  char *pcVar9;
  Type t;
  long *local_90;
  long local_80;
  long lStack_78;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  Type local_48;
  
  __val = *(ulong *)(this + 8);
  cVar7 = '\x01';
  if (9 < __val) {
    uVar5 = __val;
    cVar3 = '\x04';
    do {
      cVar7 = cVar3;
      if (uVar5 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_0021efe4;
      }
      if (uVar5 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_0021efe4;
      }
      if (uVar5 < 10000) goto LAB_0021efe4;
      bVar2 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar3 = cVar7 + '\x04';
    } while (bVar2);
    cVar7 = cVar7 + '\x01';
  }
LAB_0021efe4:
  local_50 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((__return_storage_ptr__->_M_dataplus)._M_p,
             (uint)__return_storage_ptr__->_M_string_length,__val);
  if (*(long *)(this + 8) != 0) {
    pcVar9 = *(char **)this;
    lVar8 = *(long *)(this + 8) * 0x18;
    do {
      local_90 = &local_80;
      if (*pcVar9 == '\x06') {
        Type::getStruct(&local_48);
        pSVar1 = (Structure *)
                 CONCAT44(local_48.primitiveType.type,CONCAT22(local_48._2_2_,local_48._0_2_));
        choc::text::createHexString<unsigned_long>(&local_70,(unsigned_long)pSVar1,0);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x289251);
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_80 = *plVar6;
          lStack_78 = plVar4[3];
        }
        else {
          local_80 = *plVar6;
          local_90 = (long *)*plVar4;
        }
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(pSVar1);
      }
      else {
        local_48._0_2_ = SUB42(*(undefined4 *)pcVar9,0);
        local_48.primitiveType.type = *(Primitive *)(pcVar9 + 4);
        local_48._8_8_ = *(undefined8 *)(pcVar9 + 8);
        pSVar1 = *(Structure **)(pcVar9 + 0x10);
        if (pSVar1 != (Structure *)0x0) {
          (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
        }
        local_48.isRef = false;
        local_48.isConstant = false;
        local_48.structure.object = pSVar1;
        Type::getShortIdentifierDescription_abi_cxx11_(&local_70,&local_48);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x289251);
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_80 = *plVar6;
          lStack_78 = plVar4[3];
        }
        else {
          local_80 = *plVar6;
          local_90 = (long *)*plVar4;
        }
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(pSVar1);
      }
      pcVar9 = pcVar9 + 0x18;
      lVar8 = lVar8 + -0x18;
    } while (lVar8 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getTypeArraySignature (const AST::TypeArray& types)
    {
        auto result = std::to_string (types.size());

        for (auto& t : types)
        {
            if (t.isStruct())
                result += "_" + getSignatureString (t.getStruct().get());
            else
                result += "_" + t.withConstAndRefFlags (false, false).getShortIdentifierDescription();
        }

        return result;
    }